

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O0

vector<int,_std::allocator<int>_> *
cppqc::ArbitraryImpl<std::vector<int,_std::allocator<int>_>_>::unGen(RngEngine *rng,size_t size)

{
  vector<int,_std::allocator<int>_> *in_RDI;
  undefined1 *size_00;
  RngEngine *in_stack_ffffffffffffffc0;
  Arbitrary<int> *in_stack_ffffffffffffffc8;
  StatelessGenerator<int> *in_stack_ffffffffffffffd0;
  StatelessGenerator<int> *in_stack_ffffffffffffffd8;
  
  size_00 = &stack0xffffffffffffffd8;
  StatelessGenerator<int>::StatelessGenerator<cppqc::Arbitrary<int>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  listOf<int>(in_stack_ffffffffffffffd8);
  StatelessGenerator<std::vector<int,_std::allocator<int>_>_>::unGen
            ((StatelessGenerator<std::vector<int,_std::allocator<int>_>_> *)
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(size_t)size_00);
  StatelessGenerator<std::vector<int,_std::allocator<int>_>_>::~StatelessGenerator
            ((StatelessGenerator<std::vector<int,_std::allocator<int>_>_> *)0x11eb48);
  StatelessGenerator<int>::~StatelessGenerator((StatelessGenerator<int> *)0x11eb52);
  return in_RDI;
}

Assistant:

static std::vector<T> unGen(RngEngine& rng, std::size_t size) {
    return listOf<T>().unGen(rng, size);
  }